

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopClear(sqlite3 *db,WhereLoop *p)

{
  sqlite3 *in_RSI;
  WhereLoop *in_stack_ffffffffffffffe8;
  
  if ((int *)in_RSI->szMmap != &in_RSI->errMask) {
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  }
  whereLoopClearUnion(in_RSI,in_stack_ffffffffffffffe8);
  whereLoopInit((WhereLoop *)in_RSI);
  return;
}

Assistant:

static void whereLoopClear(sqlite3 *db, WhereLoop *p){
  if( p->aLTerm!=p->aLTermSpace ) sqlite3DbFree(db, p->aLTerm);
  whereLoopClearUnion(db, p);
  whereLoopInit(p);
}